

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.h
# Opt level: O0

SpeechBubble * __thiscall SpeechBubble::operator=(SpeechBubble *this,SpeechBubble *param_1)

{
  SpeechBubble *param_1_local;
  SpeechBubble *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)param_1);
  std::shared_ptr<olc::Renderable>::operator=(&this->sprite,&param_1->sprite);
  SoLoud::Wav::operator=(&this->soundSample,&param_1->soundSample);
  this->timeElapsed = param_1->timeElapsed;
  this->position = param_1->position;
  this->scale = param_1->scale;
  return this;
}

Assistant:

SpeechBubble() = default;